

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

glist_t fsg_model_trans(fsg_model_t *fsg,int32 i,int32 j)

{
  int32 iVar1;
  fsg_model_t *local_28;
  void *val;
  int32 j_local;
  int32 i_local;
  fsg_model_t *fsg_local;
  
  if (fsg->trans[i].trans == (hash_table_t *)0x0) {
    fsg_local = (fsg_model_t *)0x0;
  }
  else {
    val._0_4_ = j;
    val._4_4_ = i;
    _j_local = fsg;
    iVar1 = hash_table_lookup_bkey(fsg->trans[i].trans,(char *)&val,4,&local_28);
    if (iVar1 < 0) {
      fsg_local = (fsg_model_t *)0x0;
    }
    else {
      fsg_local = local_28;
    }
  }
  return (glist_t)fsg_local;
}

Assistant:

glist_t
fsg_model_trans(fsg_model_t * fsg, int32 i, int32 j)
{
    void *val;

    if (fsg->trans[i].trans == NULL)
        return NULL;
    if (hash_table_lookup_bkey(fsg->trans[i].trans, (char const *) &j,
                               sizeof(j), &val) < 0)
        return NULL;
    return (glist_t) val;
}